

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type * __thiscall
duckdb::Deserializer::Read<std::pair<std::__cxx11::string,std::__cxx11::string>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> second;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> first;
  
  (*this->_vptr_Deserializer[6])(this);
  ReadProperty<std::__cxx11::string>(&first,this,0,"first");
  ReadProperty<std::__cxx11::string>(&second,this,1,"second");
  (*this->_vptr_Deserializer[7])(this);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&first,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&second);
  ::std::__cxx11::string::~string((string *)&second);
  ::std::__cxx11::string::~string((string *)&first);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_pair<T>::value, T>::type Read() {
		using FIRST_TYPE = typename is_pair<T>::FIRST_TYPE;
		using SECOND_TYPE = typename is_pair<T>::SECOND_TYPE;
		OnObjectBegin();
		auto first = ReadProperty<FIRST_TYPE>(0, "first");
		auto second = ReadProperty<SECOND_TYPE>(1, "second");
		OnObjectEnd();
		return std::make_pair(first, second);
	}